

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O3

bool __thiscall banksia::ChessBoard::isValid(ChessBoard *this)

{
  pointer pPVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  PieceType PVar6;
  uint uVar7;
  int pieceCout [2] [7];
  int local_58 [16];
  
  local_58[8] = 0;
  local_58[9] = 0;
  local_58[10] = 0;
  local_58[0xb] = 0;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[0xc] = 0;
  local_58[0xd] = 0;
  pPVar1 = (this->super_BoardCore).pieces.
           super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)(this->super_BoardCore).pieces.
                super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pPVar1 >> 3;
  lVar3 = 0;
  do {
    if (lVar5 == lVar3) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",lVar5);
    }
    PVar6 = pPVar1[lVar3].type;
    if ((PVar6 != empty) &&
       (local_58[((long)pPVar1[lVar3] >> 0x20) * 7 + (long)(int)PVar6] =
             local_58[((long)pPVar1[lVar3] >> 0x20) * 7 + (long)(int)PVar6] + 1,
       PVar6 == pawn && (int)lVar3 - 0x38U < 0xffffffd0)) {
      return false;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x40);
  uVar7 = (uint)this->castleRights[0];
  uVar4 = (uint)this->castleRights[1];
  if (uVar7 + uVar4 != 0) {
    if (this->castleRights[0] != '\0') {
      if (pPVar1[4].type != king) {
        return false;
      }
      if (pPVar1[4].side != black) {
        return false;
      }
      if ((this->CastleRight_long & uVar7) != 0) {
        if (pPVar1->type != rook) {
          return false;
        }
        if (pPVar1->side != black) {
          return false;
        }
      }
      if ((this->CastleRight_short & uVar7) != 0) {
        if (pPVar1[7].type != rook) {
          return false;
        }
        if (pPVar1[7].side != black) {
          return false;
        }
      }
    }
    if (this->castleRights[1] != '\0') {
      if (pPVar1[0x3c].type != king) {
        return false;
      }
      if (pPVar1[0x3c].side != white) {
        return false;
      }
      if ((this->CastleRight_long & uVar4) != 0) {
        if (pPVar1[0x38].type != rook) {
          return false;
        }
        if (pPVar1[0x38].side != white) {
          return false;
        }
      }
      if ((this->CastleRight_short & uVar4) != 0) {
        if (pPVar1[0x3f].type != rook) {
          return false;
        }
        if (pPVar1[0x3f].side != white) {
          return false;
        }
      }
    }
  }
  if (0 < this->enpassant) {
    iVar2 = (*(this->super_BoardCore).super_Obj._vptr_Obj[9])(this);
    if ((iVar2 != 5) && (iVar2 != 2)) {
      return false;
    }
    lVar3 = (ulong)(iVar2 == 2) * 0x10 + (long)this->enpassant;
    pPVar1 = (this->super_BoardCore).pieces.
             super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pPVar1[lVar3 + -8].type != pawn) {
      return false;
    }
    if (pPVar1[lVar3 + -8].side != (uint)(iVar2 != 2)) {
      return false;
    }
  }
  if ((local_58[0xd] < 9 &&
       ((local_58[6] < 9 && (local_58[0xc] < 0xb && (local_58[5] < 0xb && local_58[0xb] < 0xb))) &&
       ((local_58[4] < 0xb && (local_58[10] < 0xb && local_58[3] < 0xb)) &&
       ((local_58[9] < 10 && local_58[2] < 10) && (local_58[8] == 1 && local_58[1] == 1))))) &&
     (local_58[4] + local_58[5] + local_58[3] + local_58[2] + local_58[6] < 0x10)) {
    return local_58[0xb] + local_58[0xc] + local_58[10] + local_58[9] + local_58[0xd] < 0x10;
  }
  return false;
}

Assistant:

bool ChessBoard::isValid() const {
    int pieceCout[2][7] = { { 0, 0, 0, 0, 0, 0, 0}, { 0, 0, 0, 0, 0, 0, 0} };
    
    for (int i = 0; i < 64; i++) {
        auto piece = getPiece(i);
        if (piece.isEmpty()) {
            continue;
        }
        
        pieceCout[static_cast<int>(piece.side)][static_cast<int>(piece.type)] += 1;
        if (piece.type == PieceType::pawn) {
            if (i < 8 || i >= 56) {
                return false;
            }
        }
    }
    
    if (castleRights[0] + castleRights[1]) {
        if (castleRights[B]) {
            if (!isPiece(4, PieceType::king, Side::black)) {
                return false;
            }
            if (((castleRights[B] & CastleRight_long) && !isPiece(0, PieceType::rook, Side::black)) ||
                ((castleRights[B] & CastleRight_short) && !isPiece(7, PieceType::rook, Side::black))) {
                return false;
            }
        }
        
        if (castleRights[W]) {
            if (!isPiece(60, PieceType::king, Side::white)) {
                return false;
            }
            if (((castleRights[W] & CastleRight_long) && !isPiece(56, PieceType::rook, Side::white)) ||
                ((castleRights[W] & CastleRight_short) && !isPiece(63, PieceType::rook, Side::white))) {
                return false;
            }
        }
    }
    
    if (enpassant > 0) {
        auto row = getRow(enpassant);
        if (row != 2 && row != 5) {
            return false;
        }
        auto pawnPos = row == 2 ? (enpassant + 8) : (enpassant - 8);
        if (!isPiece(pawnPos, PieceType::pawn, row == 2 ? Side::black : Side::white)) {
            return false;
        }
    }
    
    bool b =
    pieceCout[0][1] == 1 && pieceCout[1][1] == 1 &&     // king
    pieceCout[0][2] <= 9 && pieceCout[1][2] <= 9 &&     // queen
    pieceCout[0][3] <= 10 && pieceCout[1][3] <= 10 &&     // rook
    pieceCout[0][4] <= 10 && pieceCout[1][4] <= 10 &&     // bishop
    pieceCout[0][5] <= 10 && pieceCout[1][5] <= 10 &&     // knight
    pieceCout[0][6] <= 8 && pieceCout[1][6] <= 8 &&       // pawn
    pieceCout[0][2]+pieceCout[0][3]+pieceCout[0][4]+pieceCout[0][5] + pieceCout[0][6] <= 15 &&
    pieceCout[1][2]+pieceCout[1][3]+pieceCout[1][4]+pieceCout[1][5] + pieceCout[1][6] <= 15;
    
    assert(b);
    return b;
}